

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

Vec_Int_t * Abc_NtkCollectEquivClasses(Abc_Ntk_t **pNtks,Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *vGia2Cla;
  Vec_Int_t *__ptr;
  int *piVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  Vec_Int_t *vNexts [2];
  Vec_Int_t *local_48;
  int *local_40;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  uVar1 = pGia->nObjs;
  vGia2Cla = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  vGia2Cla->nSize = 0;
  vGia2Cla->nCap = uVar9;
  if (uVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar9 << 2);
  }
  vGia2Cla->pArray = piVar5;
  vGia2Cla->nSize = uVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,(long)(int)uVar1 << 2);
  }
  iVar2 = (*pNtks)->vObjs->nSize;
  __ptr = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar10;
  if (iVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  __ptr->pArray = piVar6;
  __ptr->nSize = iVar2;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)iVar2 << 2);
  }
  iVar2 = pNtks[1]->vObjs->nSize;
  local_48 = __ptr;
  piVar6 = (int *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  piVar6[1] = 0;
  *piVar6 = iVar10;
  if (iVar10 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)iVar10 << 2);
  }
  *(void **)(piVar6 + 2) = pvVar7;
  piVar6[1] = iVar2;
  if (pvVar7 != (void *)0x0) {
    memset(pvVar7,0xff,(long)iVar2 << 2);
  }
  pVVar8 = (*pNtks)->vCis;
  local_40 = piVar6;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      Abc_NtkCollectAddOne
                (0,*(int *)((long)pVVar8->pArray[lVar13] + 0x10),
                 *(int *)((long)pVVar8->pArray[lVar13] + 0x40),pGia,vGia2Cla,&local_48);
      lVar13 = lVar13 + 1;
      pVVar8 = (*pNtks)->vCis;
    } while (lVar13 < pVVar8->nSize);
  }
  lVar13 = 0;
  do {
    pVVar8 = pNtks[lVar13]->vObjs;
    if (0 < pVVar8->nSize) {
      lVar14 = 0;
      do {
        pvVar7 = pVVar8->pArray[lVar14];
        if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
          Abc_NtkCollectAddOne
                    ((int)lVar13,*(int *)((long)pvVar7 + 0x10),*(int *)((long)pvVar7 + 0x40),pGia,
                     vGia2Cla,&local_48);
        }
        lVar14 = lVar14 + 1;
        pVVar8 = pNtks[lVar13]->vObjs;
      } while (lVar14 < pVVar8->nSize);
    }
    bVar16 = lVar13 == 0;
    lVar13 = lVar13 + 1;
  } while (bVar16);
  if (0 < (int)uVar1) {
    uVar15 = 0;
    do {
      uVar9 = piVar5[uVar15];
      p->nSize = 0;
      for (; -1 < (int)uVar9; uVar9 = (&local_48)[uVar9 & 1]->pArray[uVar9 >> 2]) {
        Vec_IntPush(p,uVar9);
        if ((&local_48)[uVar9 & 1]->nSize <= (int)(uVar9 >> 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
      }
      uVar9 = p->nSize;
      if (1 < (int)uVar9) {
        piVar3 = p->pArray;
        uVar12 = 0;
        uVar11 = uVar9;
        do {
          uVar11 = uVar11 - 1;
          iVar2 = piVar3[uVar12];
          piVar3[uVar12] = piVar3[(int)uVar11];
          piVar3[(int)uVar11] = iVar2;
          uVar12 = uVar12 + 1;
        } while (uVar9 >> 1 != uVar12);
        puVar4 = (uint *)p->pArray;
        uVar11 = *puVar4;
        uVar12 = 0;
        do {
          puVar4[uVar12] = puVar4[uVar12] ^ uVar11 & 2;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
        Vec_IntPush(p_00,uVar9);
        if (uVar9 < 2) {
          uVar9 = 1;
        }
        uVar12 = 0;
        do {
          Vec_IntPush(p_00,puVar4[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar1);
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    vGia2Cla->pArray = (int *)0x0;
  }
  free(vGia2Cla);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  if (*(void **)(piVar6 + 2) != (void *)0x0) {
    free(*(void **)(piVar6 + 2));
    piVar6[2] = 0;
    piVar6[3] = 0;
  }
  free(piVar6);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectEquivClasses( Abc_Ntk_t * pNtks[2], Gia_Man_t * pGia )
{
    Vec_Int_t * vClass = Vec_IntAlloc( 100 );
    Vec_Int_t * vClasses = Vec_IntAlloc( 1000 );
    Vec_Int_t * vGia2Cla = Vec_IntStartFull( Gia_ManObjNum(pGia) ); // mapping objId into classId
    Vec_Int_t * vNexts[2] = { Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[0])), Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[1])) };
    Abc_Obj_t * pObj;
    int n, i, k, Entry, fCompl;
    Abc_NtkForEachCi( pNtks[0], pObj, i )
        Abc_NtkCollectAddOne( 0, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    for ( n = 0; n < 2; n++ )
        Abc_NtkForEachNode( pNtks[n], pObj, i )
            Abc_NtkCollectAddOne( n, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    Vec_IntForEachEntry( vGia2Cla, Entry, i )
    {
        Vec_IntClear( vClass );
        for ( ; Entry >= 0; Entry = Vec_IntEntry(vNexts[Entry&1], Entry>>2) )
            Vec_IntPush( vClass, Entry );
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        Vec_IntReverseOrder( vClass );
        fCompl = 2 & Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntry( vClass, Entry, k )
            Vec_IntWriteEntry( vClass, k, Entry ^ fCompl );        
        Vec_IntPush( vClasses, Vec_IntSize(vClass) );
        Vec_IntAppend( vClasses, vClass );
    }
    Vec_IntFree( vGia2Cla );
    Vec_IntFree( vNexts[0] );
    Vec_IntFree( vNexts[1] );
    Vec_IntFree( vClass );
    return vClasses;
}